

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes(Aig_Man_t *pAig,int nFans)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  void *pvVar5;
  Vec_Int_t *p;
  int nCapMin;
  int iVar6;
  
  Aig_ManCleanMarkA(pAig);
  for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vObjs,iVar6);
    if (pvVar5 != (void *)0x0) {
      uVar3 = *(ulong *)((long)pvVar5 + 0x18);
      if ((nFans <= (int)((uint)(uVar3 >> 6) & 0x3ffffff)) && (0xfffffffd < ((uint)uVar3 & 7) - 7))
      {
        *(ulong *)((long)pvVar5 + 0x18) = uVar3 | 0x10;
      }
    }
  }
  for (iVar6 = 0; iVar6 < pAig->nRegs; iVar6 = iVar6 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar6);
    puVar1 = (ulong *)((*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffe) + 0x18);
    *puVar1 = *puVar1 & 0xffffffffffffffef;
  }
  p = Vec_IntAlloc(100);
  for (iVar6 = 0; iVar6 < pAig->vObjs->nSize; iVar6 = iVar6 + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vObjs,iVar6);
    if (((pvVar5 != (void *)0x0) && ((*(ulong *)((long)pvVar5 + 0x18) & 0x10) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)((long)pvVar5 + 0x18) & 7) - 7)) {
      iVar2 = *(int *)((long)pvVar5 + 0x24);
      iVar4 = p->nSize;
      if (iVar4 == p->nCap) {
        nCapMin = iVar4 * 2;
        if (iVar4 < 0x10) {
          nCapMin = 0x10;
        }
        Vec_IntGrow(p,nCapMin);
        iVar4 = p->nSize;
      }
      p->nSize = iVar4 + 1;
      p->pArray[iVar4] = iVar2;
    }
  }
  Aig_ManCleanMarkA(pAig);
  return p;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes( Aig_Man_t * pAig, int nFans )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanMarkA( pAig );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjRefs(pObj) >= nFans )
            pObj->fMarkA = 1;
    // unmark flop drivers
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjFanin0(pObj)->fMarkA = 0;
    // collect mapping
    vNodes = Vec_IntAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntPush( vNodes, Aig_ObjId(pObj) );
    Aig_ManCleanMarkA( pAig );
    return vNodes;
}